

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::sendBrokerErrorAck(CoreBroker *this,ActionMessage *command,int32_t errorCode)

{
  string_view str;
  string_view str_00;
  bool bVar1;
  int in_EDX;
  ActionMessage *in_RSI;
  ActionMessage *in_RDI;
  string_view sVar2;
  ActionMessage badInit;
  bool jsonReply;
  bool route_created;
  route_id newroute;
  undefined4 in_stack_fffffffffffffe88;
  int32_t in_stack_fffffffffffffe8c;
  int32_t in_stack_fffffffffffffe90;
  undefined4 uVar3;
  int in_stack_fffffffffffffe94;
  undefined4 uVar4;
  ActionMessage *in_stack_fffffffffffffe98;
  ActionMessage *M;
  undefined4 in_stack_fffffffffffffea8;
  action_t in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  GlobalFederateId local_108 [4];
  ActionMessage local_f8;
  BaseType local_40;
  BaseType local_3c;
  __sv_type local_38;
  BaseType local_28;
  BaseType local_24;
  undefined4 local_20;
  undefined1 local_1a;
  byte local_19;
  route_id local_18;
  int local_14;
  ActionMessage *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  route_id::route_id(&local_18);
  local_19 = 0;
  local_1a = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                       (local_10,use_json_serialization_flag);
  bVar1 = GlobalFederateId::isValid(&local_10->source_id);
  if (bVar1) {
    local_20 = 0;
    bVar1 = GlobalFederateId::operator==(&local_10->source_id,(GlobalBrokerId)0x0);
    if (!bVar1) {
      local_40 = (local_10->source_id).gid;
      local_3c = (BaseType)
                 getRoute((CoreBroker *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                          (GlobalFederateId)(BaseType)in_RDI);
      local_18 = (route_id)local_3c;
      goto LAB_005d145b;
    }
  }
  *(int *)(in_RDI[3].payload.buffer._M_elems + 0x38) =
       *(int *)(in_RDI[3].payload.buffer._M_elems + 0x38) + 1;
  local_28 = (BaseType)generateRouteId(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  local_24 = local_28;
  local_18 = (route_id)local_28;
  in_stack_fffffffffffffeac = ActionMessage::getExtraData((ActionMessage *)0x5d13bf);
  ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  (**(code **)(*(long *)in_RDI + 0x120))
            (in_RDI,local_28,in_stack_fffffffffffffeac,local_38._M_len,local_38._M_str);
  local_19 = 1;
LAB_005d145b:
  M = &local_f8;
  ActionMessage::ActionMessage(in_RDI,in_stack_fffffffffffffeac);
  setActionFlag<helics::ActionMessage,helics::GeneralFlags>(M,error_flag);
  GlobalFederateId::GlobalFederateId(local_108,(GlobalBrokerId)(in_RDI->dest_handle).hid);
  local_f8.source_id.gid = local_108[0].gid;
  sVar2 = ActionMessage::name((ActionMessage *)0x5d14b5);
  sVar2._M_len = (char *)sVar2._M_len;
  uVar3 = sVar2._M_str._0_4_;
  uVar4 = sVar2._M_str._4_4_;
  sVar2._M_len._4_4_ = in_stack_fffffffffffffe8c;
  sVar2._M_len._0_4_ = in_stack_fffffffffffffe88;
  sVar2._M_str._0_4_ = uVar3;
  sVar2._M_str._4_4_ = uVar4;
  ActionMessage::name((ActionMessage *)0x5d14ec,sVar2);
  local_f8.messageID = local_14;
  if (local_14 == 9) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)M,sVar2._M_len);
    str_00._M_len._4_4_ = in_stack_fffffffffffffebc;
    str_00._M_len._0_4_ = in_stack_fffffffffffffeb8;
    str_00._M_str = in_stack_fffffffffffffec0;
    ActionMessage::setString(in_RDI,in_stack_fffffffffffffeac,str_00);
  }
  else if (local_14 == 0xe) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)M,sVar2._M_len);
    str._M_len._4_4_ = in_stack_fffffffffffffebc;
    str._M_len._0_4_ = in_stack_fffffffffffffeb8;
    str._M_str = in_stack_fffffffffffffec0;
    ActionMessage::setString(in_RDI,in_stack_fffffffffffffeac,str);
  }
  (**(code **)(*(long *)in_RDI + 0x110))(in_RDI,local_18.rid,&local_f8);
  if ((local_19 & 1) != 0) {
    (**(code **)(*(long *)in_RDI + 0x128))(in_RDI,local_18.rid);
  }
  ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(uVar4,uVar3));
  return;
}

Assistant:

void CoreBroker::sendBrokerErrorAck(ActionMessage& command, std::int32_t errorCode)
{
    route_id newroute;
    bool route_created = false;
    const bool jsonReply = checkActionFlag(command, use_json_serialization_flag);
    if ((!command.source_id.isValid()) || (command.source_id == parent_broker_id)) {
        newroute = generateRouteId(jsonReply ? json_route_code : 0, routeCount++);
        addRoute(newroute, command.getExtraData(), command.getString(targetStringLoc));
        route_created = true;
    } else {
        newroute = getRoute(command.source_id);
    }
    ActionMessage badInit(CMD_BROKER_ACK);
    setActionFlag(badInit, error_flag);
    badInit.source_id = global_broker_id_local;
    badInit.name(command.name());
    badInit.messageID = errorCode;
    switch (errorCode) {
        case broker_terminating:
            badInit.setString(0, "broker is terminating");
            break;
        case mismatch_broker_key_error_code:
            badInit.setString(0, "broker key does not match");
            break;
        default:
            break;
    }
    transmit(newroute, badInit);

    if (route_created) {
        removeRoute(newroute);
    }
}